

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  commentSAXFunc p_Var3;
  xmlChar xVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  char *msg;
  ulong len;
  long lVar8;
  xmlParserInputPtr in;
  xmlChar *pxVar9;
  ulong uVar10;
  xmlChar *pxVar11;
  size_t __n;
  ulong local_40;
  
  uVar10 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    uVar10 = 10000000;
  }
  in = ctxt->input;
  pxVar9 = in->cur;
  if (*pxVar9 != '<') {
    return;
  }
  if (pxVar9[1] != '!') {
    return;
  }
  if (pxVar9[2] != '-') {
    return;
  }
  if (pxVar9[3] != '-') {
    return;
  }
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_COMMENT;
  iVar2 = in->id;
  in->cur = pxVar9 + 4;
  in->col = in->col + 4;
  if (pxVar9[4] == '\0') {
    xmlParserInputGrow(in,0xfa);
    in = ctxt->input;
  }
  if (ctxt->progressive == 0) {
    if ((500 < (long)in->cur - (long)in->base) && ((long)in->end - (long)in->cur < 500)) {
      xmlSHRINK(ctxt);
      in = ctxt->input;
      if (ctxt->progressive != 0) goto LAB_0015ac81;
    }
    if ((long)in->end - (long)in->cur < 0xfa) {
      xmlGROW(ctxt);
      in = ctxt->input;
    }
  }
LAB_0015ac81:
  pxVar9 = in->cur;
  xVar4 = *pxVar9;
  local_40 = 100;
  len = 0;
  pxVar6 = (xmlChar *)0x0;
  do {
    pxVar11 = pxVar6;
    if (xVar4 == '\n') {
      iVar5 = in->line;
      pxVar6 = pxVar9;
      do {
        iVar5 = iVar5 + 1;
        in->line = iVar5;
        in->col = 1;
        pxVar9 = pxVar6 + 1;
        pxVar7 = pxVar6 + 1;
        pxVar6 = pxVar9;
      } while (*pxVar7 == '\n');
    }
LAB_0015acc5:
    iVar5 = in->col;
    while( true ) {
      for (; (xVar4 = *pxVar9, '-' < (char)xVar4 || (xVar4 == '\t' || (byte)(xVar4 - 0x20) < 0xd));
          pxVar9 = pxVar9 + 1) {
        iVar5 = iVar5 + 1;
      }
      in->col = iVar5;
      if (*pxVar9 != '\n') break;
      iVar5 = in->line;
      do {
        iVar5 = iVar5 + 1;
        in->line = iVar5;
        in->col = 1;
        pxVar6 = pxVar9 + 1;
        pxVar9 = pxVar9 + 1;
      } while (*pxVar6 == '\n');
      iVar5 = 1;
    }
    __n = (long)pxVar9 - (long)in->cur;
    pxVar6 = pxVar11;
    if (((__n != 0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
       (ctxt->sax->comment != (commentSAXFunc)0x0)) {
      if (pxVar11 == (xmlChar *)0x0) {
        if ((*pxVar9 != '-') || (lVar8 = 1, pxVar9[1] != '-')) {
          lVar8 = 100;
        }
        local_40 = lVar8 + __n;
        pxVar6 = (xmlChar *)(*xmlMallocAtomic)(local_40);
        if (pxVar6 == (xmlChar *)0x0) {
LAB_0015afea:
          xmlErrMemory(ctxt,(char *)0x0);
          goto LAB_0015aff4;
        }
        len = 0;
      }
      else if (local_40 <= __n + len + 1) {
        local_40 = local_40 + __n + len + 100;
        pxVar6 = (xmlChar *)(*xmlRealloc)(pxVar11,local_40);
        if (pxVar6 == (xmlChar *)0x0) {
          (*xmlFree)(pxVar11);
          goto LAB_0015afea;
        }
      }
      memcpy(pxVar6 + len,ctxt->input->cur,__n);
      len = len + __n;
      pxVar6[len] = '\0';
    }
    if (uVar10 < len) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",(xmlChar *)0x0);
LAB_0015af4a:
      (*xmlFree)(pxVar6);
      return;
    }
    in = ctxt->input;
    in->cur = pxVar9;
    xVar4 = *pxVar9;
    pxVar7 = pxVar9;
    if (xVar4 == '\n') {
      in->line = in->line + 1;
      pxVar7 = pxVar9 + 1;
      in->col = 1;
      xVar4 = pxVar9[1];
    }
    pxVar11 = pxVar6;
    if ((xVar4 == '\r') && (pxVar7[1] == '\n')) {
      in->cur = pxVar7 + 1;
      in->line = in->line + 1;
      pxVar9 = pxVar7 + 2;
      in->col = 1;
      goto LAB_0015acc5;
    }
    if ((ctxt->progressive == 0) &&
       (((((long)pxVar9 - (long)in->base < 0x1f5 || (499 < (long)in->end - (long)pxVar9)) ||
         (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
        ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)))) {
      xmlGROW(ctxt);
    }
    if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015af4a;
    in = ctxt->input;
    pxVar9 = in->cur;
    xVar4 = *pxVar9;
    if (xVar4 == '-') {
      if (pxVar9[1] == '-') {
        if (pxVar9[2] == '>') {
          if (in->id != iVar2) {
            xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                           "comment doesn\'t start and stop in the same entity\n");
            in = ctxt->input;
            pxVar9 = in->cur;
          }
          in->cur = pxVar9 + 3;
          in->col = in->col + 3;
          if (pxVar9[3] == '\0') {
            xmlParserInputGrow(in,0xfa);
          }
          if (((ctxt->sax == (_xmlSAXHandler *)0x0) ||
              (p_Var3 = ctxt->sax->comment, p_Var3 == (commentSAXFunc)0x0)) ||
             (ctxt->disableSAX != 0)) {
            if (pxVar6 != (xmlChar *)0x0) goto LAB_0015afca;
          }
          else if (pxVar6 == (xmlChar *)0x0) {
            (*p_Var3)(ctxt->userData,"");
          }
          else {
            (*p_Var3)(ctxt->userData,pxVar6);
LAB_0015afca:
            (*xmlFree)(pxVar6);
          }
          if (ctxt->instate == XML_PARSER_EOF) {
            return;
          }
          goto LAB_0015aff4;
        }
        if (pxVar6 == (xmlChar *)0x0) {
          msg = "Double hyphen within comment\n";
          pxVar7 = (xmlChar *)0x0;
        }
        else {
          msg = "Double hyphen within comment: <!--%.50s\n";
          pxVar7 = pxVar6;
        }
        xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,msg,pxVar7);
        if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015af4a;
        pxVar9 = pxVar9 + 1;
        in = ctxt->input;
        iVar5 = in->col + 1;
        in->col = iVar5;
      }
      else {
        iVar5 = in->col;
      }
      pxVar9 = pxVar9 + 1;
      in->col = iVar5 + 1;
      goto LAB_0015acc5;
    }
    if (1 < (byte)(xVar4 - 9) && (char)xVar4 < ' ') {
      xmlParseCommentComplex(ctxt,pxVar6,len,local_40);
LAB_0015aff4:
      ctxt->instate = xVar1;
      return;
    }
  } while( true );
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    xmlParserInputState state;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;
    int inputid;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;
    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    inputid = ctxt->input->id;
    SKIP(4);
    SHRINK;
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
	    if ((ctxt->sax != NULL) &&
		(ctxt->sax->comment != NULL)) {
		if (buf == NULL) {
		    if ((*in == '-') && (in[1] == '-'))
		        size = nbchar + 1;
		    else
		        size = XML_PARSER_BUFFER_SIZE + nbchar;
		    buf = (xmlChar *) xmlMallocAtomic(size);
		    if (buf == NULL) {
		        xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    len = 0;
		} else if (len + nbchar + 1 >= size) {
		    xmlChar *new_buf;
		    size  += len + nbchar + XML_PARSER_BUFFER_SIZE;
		    new_buf = (xmlChar *) xmlRealloc(buf, size);
		    if (new_buf == NULL) {
		        xmlFree (buf);
			xmlErrMemory(ctxt, NULL);
			ctxt->instate = state;
			return;
		    }
		    buf = new_buf;
		}
		memcpy(&buf[len], ctxt->input->cur, nbchar);
		len += nbchar;
		buf[len] = 0;
	    }
	}
        if (len > maxLength) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            return;
        }
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
        if (ctxt->instate == XML_PARSER_EOF) {
            xmlFree(buf);
            return;
        }
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    if (ctxt->input->id != inputid) {
			xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
			               "comment doesn't start and stop in the"
                                       " same entity\n");
		    }
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    if (ctxt->instate != XML_PARSER_EOF)
			ctxt->instate = state;
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
                if (ctxt->instate == XML_PARSER_EOF) {
                    xmlFree(buf);
                    return;
                }
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
    ctxt->instate = state;
    return;
}